

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O2

ssize_t chrono::ChBezierCurve::read(int __fd,void *__buf,size_t __nbytes)

{
  istream *piVar1;
  ChBezierCurve *pCVar2;
  ChException *this;
  undefined4 in_register_0000003c;
  __shared_ptr<chrono::ChBezierCurve,(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar3;
  double y;
  double local_650;
  double local_648;
  double z;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> points;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> inCV;
  size_t numPoints;
  double x;
  pointer pCStack_5f0;
  pointer local_5e8;
  double outZ;
  double outY;
  double outX;
  double inZ;
  double inY;
  double inX;
  double z_1;
  double y_1;
  size_t numCols;
  string line;
  string local_578 [2];
  ifstream ifile;
  istringstream jss;
  istringstream iss;
  
  this_00 = (__shared_ptr<chrono::ChBezierCurve,(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(in_register_0000003c,__fd);
  std::ifstream::ifstream(&ifile);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::ios::exceptions((int)&ifile + (int)*(undefined8 *)(_ifile + -0x18));
  std::ifstream::open((char *)&ifile,(_Ios_Openmode)*__buf);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&ifile,(string *)&line);
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&line,_S_in);
  piVar1 = std::istream::_M_extract<unsigned_long>((ulong *)&iss);
  std::istream::_M_extract<unsigned_long>((ulong *)piVar1);
  if (numCols == 9) {
    points.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    inCV.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_5e8 = (pointer)0x0;
    points.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    points.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    inCV.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    inCV.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    x = 0.0;
    pCStack_5f0 = (pointer)0x0;
    for (uVar3 = 0; uVar3 < numPoints; uVar3 = uVar3 + 1) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ifile,(string *)&line);
      std::__cxx11::istringstream::istringstream((istringstream *)&jss,(string *)&line,_S_in);
      piVar1 = std::istream::_M_extract<double>((double *)&jss);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      std::istream::_M_extract<double>((double *)piVar1);
      y = z;
      local_650 = y_1;
      local_648 = z_1;
      std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
      emplace_back<chrono::ChVector<double>>
                ((vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
                 &points,(ChVector<double> *)&y);
      y = inX;
      local_650 = inY;
      local_648 = inZ;
      std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
      emplace_back<chrono::ChVector<double>>
                ((vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)&inCV,
                 (ChVector<double> *)&y);
      y = outX;
      local_650 = outY;
      local_648 = outZ;
      std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
      emplace_back<chrono::ChVector<double>>
                ((vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)&x,
                 (ChVector<double> *)&y);
      std::__cxx11::istringstream::~istringstream((istringstream *)&jss);
    }
    std::ifstream::close();
    pCVar2 = (ChBezierCurve *)::operator_new(0x48);
    ChBezierCurve(pCVar2,&points,&inCV,
                  (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)&x
                 );
    std::__shared_ptr<chrono::ChBezierCurve,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChBezierCurve,void>(this_00,pCVar2);
    std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
    ~_Vector_base((_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   *)&x);
    std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
    ~_Vector_base(&inCV.
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 );
  }
  else {
    if (numCols != 3) {
      std::ifstream::close();
      this = (ChException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)local_578,"Invalid input file",(allocator *)&jss);
      ChException::ChException(this,local_578);
      __cxa_throw(this,&ChException::typeinfo,ChException::~ChException);
    }
    points.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    points.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    points.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (uVar3 = 0; uVar3 < numPoints; uVar3 = uVar3 + 1) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ifile,(string *)&line);
      std::__cxx11::istringstream::istringstream((istringstream *)&jss,(string *)&line,_S_in);
      piVar1 = std::istream::_M_extract<double>((double *)&jss);
      piVar1 = std::istream::_M_extract<double>((double *)piVar1);
      std::istream::_M_extract<double>((double *)piVar1);
      inCV.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)x;
      inCV.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)y;
      inCV.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)z;
      std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
      emplace_back<chrono::ChVector<double>>
                ((vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
                 &points,(ChVector<double> *)&inCV);
      std::__cxx11::istringstream::~istringstream((istringstream *)&jss);
    }
    std::ifstream::close();
    pCVar2 = (ChBezierCurve *)::operator_new(0x48);
    ChBezierCurve(pCVar2,&points);
    std::__shared_ptr<chrono::ChBezierCurve,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChBezierCurve,void>(this_00,pCVar2);
  }
  std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
  ~_Vector_base(&points.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               );
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&ifile);
  return (ssize_t)this_00;
}

Assistant:

std::shared_ptr<ChBezierCurve> ChBezierCurve::read(const std::string& filename) {
    // Open input file stream
    std::ifstream ifile;
    std::string line;
    try {
        ifile.exceptions(std::ios::failbit | std::ios::badbit | std::ios::eofbit);
        ifile.open(filename.c_str());
    } catch (const std::exception &) {
        throw ChException("Cannot open input file");
    }

    // Read number of knots and type of curve
    size_t numPoints;
    size_t numCols;

    std::getline(ifile, line);
    std::istringstream iss(line);
    iss >> numPoints >> numCols;

    if (numCols == 3) {
        // Read knots from the following numPoints lines
        std::vector<ChVector<> > points;

        for (size_t i = 0; i < numPoints; i++) {
            double x, y, z;

            std::getline(ifile, line);
            std::istringstream jss(line);
            jss >> x >> y >> z;

            points.push_back(ChVector<>(x, y, z));
        }

        ifile.close();
        return std::shared_ptr<ChBezierCurve>(new ChBezierCurve(points));
    }

    if (numCols == 9) {
        // Read knots and control points from the following numPoints lines
        std::vector<ChVector<> > points;
        std::vector<ChVector<> > inCV;
        std::vector<ChVector<> > outCV;

        for (size_t i = 0; i < numPoints; i++) {
            double x, y, z;
            double inX, inY, inZ;
            double outX, outY, outZ;

            std::getline(ifile, line);
            std::istringstream jss(line);
            jss >> x >> y >> z >> inX >> inY >> inZ >> outX >> outY >> outZ;

            points.push_back(ChVector<>(x, y, z));
            inCV.push_back(ChVector<>(inX, inY, inZ));
            outCV.push_back(ChVector<>(outX, outY, outZ));
        }

        ifile.close();
        return std::shared_ptr<ChBezierCurve>(new ChBezierCurve(points, inCV, outCV));
    }

    // Not the expected number of columns.  Close the file and throw an exception.
    ifile.close();
    throw ChException("Invalid input file");
}